

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void __thiscall r_exec::View::reset(View *this)

{
  double dVar1;
  float fVar2;
  
  this->sln_changes = 0;
  this->acc_sln = 0.0;
  this->act_changes = 0;
  this->acc_act = 0.0;
  this->vis_changes = 0;
  this->acc_vis = 0.0;
  this->res_changes = 0;
  this->acc_res = 0.0;
  this->periods_at_low_sln = 0;
  this->periods_at_high_sln = 0;
  this->periods_at_low_act = 0;
  this->periods_at_high_act = 0;
  fVar2 = (float)r_code::Atom::asFloat();
  this->initial_sln = (double)fVar2;
  if ((this->super_View).object.object == (_Object *)0x0) {
    dVar1 = 0.0;
  }
  else {
    fVar2 = (float)r_code::Atom::asFloat();
    dVar1 = (double)fVar2;
  }
  this->initial_act = dVar1;
  return;
}

Assistant:

void View::reset()
{
    reset_ctrl_values();
    reset_init_sln();
    reset_init_act();
}